

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

xmlDictEntry *
xmlDictFindEntry(xmlDict *dict,xmlChar *prefix,xmlChar *name,int len,uint hashValue,int *pfound)

{
  xmlChar *str;
  int iVar1;
  uint uVar2;
  uint uVar3;
  xmlDictEntry *pxVar4;
  uint uVar5;
  
  uVar5 = (int)dict->size - 1;
  uVar3 = uVar5 & hashValue;
  pxVar4 = dict->table + uVar3;
  if (dict->table[uVar3].hashValue == 0) {
    iVar1 = 0;
LAB_0012add9:
    *pfound = iVar1;
    return pxVar4;
  }
  uVar2 = 0;
  do {
    uVar3 = uVar3 + 1;
    if (pxVar4->hashValue == hashValue) {
      str = pxVar4->name;
      if (prefix == (xmlChar *)0x0) {
        iVar1 = strncmp((char *)str,(char *)name,(ulong)(uint)len);
        if ((iVar1 == 0) && (str[(uint)len] == '\0')) goto LAB_0012add4;
      }
      else {
        iVar1 = xmlStrQEqual(prefix,name,str);
        if (iVar1 != 0) {
LAB_0012add4:
          iVar1 = 1;
          goto LAB_0012add9;
        }
      }
    }
    if ((uVar3 & uVar5) == 0) {
      pxVar4 = dict->table;
    }
    else {
      pxVar4 = pxVar4 + 1;
    }
    iVar1 = 0;
    if ((pxVar4->hashValue == 0) || (uVar2 = uVar2 + 1, (uVar3 - pxVar4->hashValue & uVar5) < uVar2)
       ) goto LAB_0012add9;
  } while( true );
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static xmlDictEntry *
xmlDictFindEntry(const xmlDict *dict, const xmlChar *prefix,
                 const xmlChar *name, int len, unsigned hashValue,
                 int *pfound) {
    xmlDictEntry *entry;
    unsigned mask, pos, displ;
    int found = 0;

    mask = dict->size - 1;
    pos = hashValue & mask;
    entry = &dict->table[pos];

    if (entry->hashValue != 0) {
        /*
         * Robin hood hashing: abort if the displacement of the entry
         * is smaller than the displacement of the key we look for.
         * This also stops at the correct position when inserting.
         */
        displ = 0;

        do {
            if (entry->hashValue == hashValue) {
                if (prefix == NULL) {
                    /*
                     * name is not necessarily null-terminated.
                     */
                    if ((strncmp((const char *) entry->name,
                                 (const char *) name, len) == 0) &&
                        (entry->name[len] == 0)) {
                        found = 1;
                        break;
                    }
                } else {
                    if (xmlStrQEqual(prefix, name, entry->name)) {
                        found = 1;
                        break;
                    }
                }
            }

            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = dict->table;
        } while ((entry->hashValue != 0) &&
                 (((pos - entry->hashValue) & mask) >= displ));
    }

    *pfound = found;
    return(entry);
}